

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O2

int CoreVfwprintf(CPalThread *pthrCurrent,PAL_FILE *stream,char16_t *format,__va_list_tag *aparg)

{
  undefined4 uVar1;
  long lVar2;
  LPCSTR lpMultiByteStr;
  byte bVar3;
  undefined1 Prefix_00 [4];
  INT Width_00;
  BOOL BVar4;
  int iVar5;
  uint uVar6;
  errno_t eVar7;
  INT IVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  CPalThread *lpWideCharStr;
  size_t sVar12;
  PAL_FILE *stream_00;
  undefined4 *puVar13;
  INT *pIVar14;
  undefined8 *puVar15;
  short *psVar16;
  CPalThread *pthrCurrent_00;
  int *piVar17;
  undefined2 *puVar18;
  int iVar19;
  CPalThread *in_R8;
  LPINT in_R9;
  CPalThread *pCVar20;
  long lVar21;
  size_t szSize;
  long in_FS_OFFSET;
  ulong uStack_8b8;
  va_list apcopy;
  CPalThread *local_888;
  LPCWSTR Fmt;
  int local_878;
  WCHAR TempWChar [2];
  undefined1 local_870 [4];
  INT Flags;
  INT Prefix;
  INT Type;
  INT Width;
  INT Precision;
  undefined1 auStack_858 [8];
  va_list ap;
  undefined1 local_838 [8];
  char TempSprintfStrBuffer [1024];
  CHAR TempBuff [1024];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_888 = (CPalThread *)format;
  if (PAL_InitializeChakraCoreCalled) {
    ap[0].overflow_arg_area = aparg->reg_save_area;
    auStack_858._0_4_ = aparg->gp_offset;
    auStack_858._4_4_ = aparg->fp_offset;
    ap[0]._0_8_ = aparg->overflow_arg_area;
    local_878 = -1;
    iVar10 = 0;
LAB_0011c35f:
    while( true ) {
      if (*(short *)&local_888->_vptr_CPalThread == 0x25) break;
      iVar19 = iVar10;
      bVar3 = PAL_InitializeChakraCoreCalled;
      if (*(short *)&local_888->_vptr_CPalThread == 0) goto joined_r0x0011cc5d;
LAB_0011c41c:
      pCVar20 = local_888;
      local_888 = (CPalThread *)((long)&local_888->_vptr_CPalThread + 2);
      iVar5 = Internal_Convertfwrite
                        (pCVar20,(void *)0x1,(size_t)stream->bsdFilePtr,(size_t)aparg,(FILE *)in_R8,
                         (BOOL)in_R9);
      iVar19 = local_878;
      bVar3 = PAL_InitializeChakraCoreCalled;
      if (iVar5 == -1) goto joined_r0x0011cc5d;
      iVar10 = iVar10 + 1;
    }
    in_R8 = (CPalThread *)&Prefix;
    in_R9 = &Type;
    aparg = (__va_list_tag *)local_870;
    BVar4 = Internal_ExtractFormatW
                      (local_888,(LPCWSTR *)&local_888,TempSprintfStrBuffer + 0x3f8,(LPINT)TempWChar
                       ,(LPINT)in_R8,in_R9,(LPINT)local_870,&Flags);
    Prefix_00 = local_870;
    if (BVar4 == 0) goto LAB_0011c41c;
    IVar8 = Flags;
    Precision = iVar10;
    if ((local_870 == (undefined1  [4])0x4) || (local_870 == (undefined1  [4])0x2)) {
      if ((Flags & 0xfffffffeU) == 2) {
LAB_0011c3d5:
        if (Prefix == -3) {
          if ((uint)auStack_858._0_4_ < 0x29) {
            auStack_858._0_4_ = auStack_858._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar10 = -3;
        }
        else {
          iVar10 = Prefix;
          if (Prefix == -2) {
            uVar11 = (ulong)auStack_858 & 0xffffffff;
            if (uVar11 < 0x29) {
              auStack_858._0_4_ = auStack_858._0_4_ + 8;
              piVar17 = (int *)(uVar11 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar17 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            iVar10 = *piVar17;
            Prefix = iVar10;
          }
        }
        if (Type == -4) {
          if ((uint)auStack_858._0_4_ < 0x29) {
            auStack_858._0_4_ = auStack_858._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar5 = -4;
        }
        else {
          iVar5 = Type;
          if (Type == -2) {
            uVar11 = (ulong)auStack_858 & 0xffffffff;
            if (uVar11 < 0x29) {
              auStack_858._0_4_ = auStack_858._0_4_ + 8;
              piVar17 = (int *)(uVar11 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar17 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            iVar5 = *piVar17;
            Type = iVar5;
          }
        }
        uVar11 = (ulong)auStack_858 & 0xffffffff;
        Width = CONCAT31(Width._1_3_,local_870 == (undefined1  [4])0x4 || IVar8 == 2);
        if (local_870 == (undefined1  [4])0x4 || IVar8 == 2) {
          if ((uint)auStack_858._0_4_ < 0x29) {
            auStack_858._0_4_ = auStack_858._0_4_ + 8;
            puVar15 = (undefined8 *)(uVar11 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar15 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpWideCharStr = (CPalThread *)*puVar15;
        }
        else {
          if ((uint)auStack_858._0_4_ < 0x29) {
            auStack_858._0_4_ = auStack_858._0_4_ + 8;
            puVar15 = (undefined8 *)(uVar11 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar15 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          lpMultiByteStr = (LPCSTR)*puVar15;
          uVar6 = MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)0x0,0);
          if (uVar6 == 0) {
            fprintf(_stderr,"] %s %s:%d","CoreVfwprintf",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/printfcpp.cpp"
                    ,0x4d8);
            fprintf(_stderr,"Unable to convert from multibyte  to wide char.\n");
            iVar19 = local_878;
            bVar3 = PAL_InitializeChakraCoreCalled;
            goto joined_r0x0011cc5d;
          }
          lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc((ulong)uVar6 * 2);
          iVar19 = local_878;
          bVar3 = PAL_InitializeChakraCoreCalled;
          if (lpWideCharStr == (CPalThread *)0x0) goto joined_r0x0011cc5d;
          in_R9 = (LPINT)(ulong)uVar6;
          in_R8 = lpWideCharStr;
          MultiByteToWideChar(0,0,lpMultiByteStr,-1,(LPWSTR)lpWideCharStr,uVar6);
        }
        sVar12 = PAL_wcslen((char16_t *)lpWideCharStr);
        lVar21 = (sVar12 << 0x20) + 0x100000000;
        stream_00 = (PAL_FILE *)CorUnix::InternalMalloc(lVar21 >> 0x1f);
        if (stream_00 == (PAL_FILE *)0x0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011cd4c;
          piVar17 = __errno_location();
          *piVar17 = 8;
          if ((char)Width == '\0') {
LAB_0011ccbc:
            CorUnix::InternalFree(lpWideCharStr);
          }
          goto LAB_0011cd0c;
        }
        if (iVar5 != -3) {
          iVar19 = (int)sVar12;
          if ((iVar5 < 1) || (iVar19 <= iVar5)) {
            PAL_wcscpy((char16_t *)stream_00,(char16_t *)lpWideCharStr);
            goto LAB_0011c862;
          }
          eVar7 = wcsncpy_s((char16_t_conflict *)stream_00,lVar21 >> 0x20,
                            (char16_t_conflict *)lpWideCharStr,(ulong)(iVar5 + 1));
          iVar19 = iVar5;
          if (eVar7 == 0) goto LAB_0011c862;
LAB_0011cbda:
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011cd4c;
          if ((char)Width == '\0') {
            CorUnix::InternalFree(lpWideCharStr);
          }
          CorUnix::InternalFree(stream_00);
          iVar19 = local_878;
          bVar3 = PAL_InitializeChakraCoreCalled;
          goto joined_r0x0011cc5d;
        }
        *(undefined2 *)&stream_00->bsdFilePtr = 0;
        iVar19 = 0;
LAB_0011c862:
        aparg = (__va_list_tag *)(ulong)(uint)TempWChar;
        IVar8 = Internal_AddPaddingVfwprintf
                          ((CPalThread *)stream,stream_00,(LPWSTR)(ulong)(uint)(iVar10 - iVar19),
                           (INT)TempWChar,(INT)in_R8,(BOOL)in_R9);
        if (IVar8 == -1) goto LAB_0011cbda;
        Precision = Precision + IVar8;
        CorUnix::InternalFree(stream_00);
        pthrCurrent_00 = lpWideCharStr;
        iVar10 = Precision;
        if ((char)Width == '\0') {
LAB_0011cb91:
          CorUnix::InternalFree(pthrCurrent_00);
          iVar10 = Precision;
        }
      }
      else {
        if (Flags != 1 || local_870 != (undefined1  [4])0x2) goto LAB_0011c4b8;
        uVar6 = auStack_858._0_4_;
        if (Prefix + 3U < 2) {
          if ((uint)auStack_858._0_4_ < 0x29) {
            auStack_858._0_4_ = auStack_858._0_4_ + 8;
            uVar6 = auStack_858._0_4_;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Type & 0xfffffffdU) == 0xfffffffc) {
          if (uVar6 < 0x29) {
            uVar6 = uVar6 + 8;
            auStack_858._0_4_ = uVar6;
            goto LAB_0011c8e0;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_0011c901:
          puVar18 = (undefined2 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
LAB_0011c8e0:
          if (0x28 < uVar6) goto LAB_0011c901;
          auStack_858._0_4_ = uVar6 + 8;
          puVar18 = (undefined2 *)((ulong)uVar6 + (long)ap[0].overflow_arg_area);
        }
        Fmt._4_2_ = *puVar18;
        Fmt._6_2_ = 0;
        aparg = (__va_list_tag *)(ulong)(uint)TempWChar;
        IVar8 = Internal_AddPaddingVfwprintf
                          ((CPalThread *)stream,(PAL_FILE *)((long)&Fmt + 4),
                           (LPWSTR)(ulong)(Prefix - 1),(INT)TempWChar,(INT)in_R8,(BOOL)in_R9);
        iVar19 = local_878;
        bVar3 = PAL_InitializeChakraCoreCalled;
        if (IVar8 == -1) goto joined_r0x0011cc5d;
        iVar10 = iVar10 + IVar8;
      }
      goto LAB_0011c35f;
    }
    if (Flags != 3) {
LAB_0011c4b8:
      if (Flags != 6) {
        if (Flags == 5 && ((uint)local_870 ^ 1) == 0) {
          uVar11 = (ulong)auStack_858 & 0xffffffff;
          if (uVar11 < 0x29) {
            auStack_858._0_4_ = auStack_858._0_4_ + 8;
            puVar13 = (undefined4 *)(uVar11 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar13 = (undefined4 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar1 = *puVar13;
          uVar6 = snprintf(local_838,0x400,TempSprintfStrBuffer + 0x3f8,(long)(short)uVar1);
          if (0x3ff < uVar6) {
            szSize = (size_t)(int)(uVar6 + 1);
            lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc(szSize);
            if (lpWideCharStr == (CPalThread *)0x0) goto LAB_0011cd33;
            uVar6 = (uint)(short)uVar1;
LAB_0011cb0f:
            snprintf((char *)lpWideCharStr,szSize,TempSprintfStrBuffer + 0x3f8,(ulong)uVar6);
            pCVar20 = lpWideCharStr;
            goto LAB_0011cb1d;
          }
        }
        else {
          if (((uint)local_870 ^ 1) != 0 || Flags != 4) goto LAB_0011c59c;
          uVar11 = (ulong)auStack_858 & 0xffffffff;
          if (uVar11 < 0x29) {
            auStack_858._0_4_ = auStack_858._0_4_ + 8;
            psVar16 = (short *)(uVar11 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar16 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          uVar6 = (uint)*psVar16;
          uVar9 = snprintf(local_838,0x400,TempSprintfStrBuffer + 0x3f8,(ulong)uVar6);
          if (0x3ff < uVar9) {
            szSize = (size_t)(int)(uVar9 + 1);
            lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc(szSize);
            if (lpWideCharStr == (CPalThread *)0x0) goto LAB_0011cd33;
            goto LAB_0011cb0f;
          }
        }
        lpWideCharStr = (CPalThread *)0x0;
        pCVar20 = (CPalThread *)local_838;
        goto LAB_0011cb1d;
      }
      if (Prefix == -2) {
        uVar11 = (ulong)auStack_858 & 0xffffffff;
        if (uVar11 < 0x29) {
          auStack_858._0_4_ = auStack_858._0_4_ + 8;
          pIVar14 = (INT *)(uVar11 + (long)ap[0].overflow_arg_area);
        }
        else {
          pIVar14 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Prefix = *pIVar14;
      }
      if (Type == -2) {
        uVar11 = (ulong)auStack_858 & 0xffffffff;
        if (uVar11 < 0x29) {
          auStack_858._0_4_ = auStack_858._0_4_ + 8;
          pIVar14 = (INT *)(uVar11 + (long)ap[0].overflow_arg_area);
        }
        else {
          pIVar14 = (INT *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        Type = *pIVar14;
      }
      if (local_870 == (undefined1  [4])0x1) {
        uVar11 = (ulong)auStack_858 & 0xffffffff;
        if (uVar11 < 0x29) {
          aparg = (__va_list_tag *)(ulong)(auStack_858._0_4_ + 8);
          auStack_858._0_4_ = auStack_858._0_4_ + 8;
          puVar15 = (undefined8 *)(uVar11 + (long)ap[0].overflow_arg_area);
        }
        else {
          aparg = (__va_list_tag *)(ap[0]._0_8_ + 8);
          puVar15 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = aparg;
        }
        *(short *)*puVar15 = (short)iVar10;
      }
      else {
        uVar11 = (ulong)auStack_858 & 0xffffffff;
        if (uVar11 < 0x29) {
          aparg = (__va_list_tag *)(ulong)(auStack_858._0_4_ + 8);
          auStack_858._0_4_ = auStack_858._0_4_ + 8;
          puVar15 = (undefined8 *)(uVar11 + (long)ap[0].overflow_arg_area);
        }
        else {
          aparg = (__va_list_tag *)(ap[0]._0_8_ + 8);
          puVar15 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = aparg;
        }
        *(int *)*puVar15 = iVar10;
      }
      goto LAB_0011c35f;
    }
    IVar8 = 3;
    if (((uint)TempWChar & 4) != 0) goto LAB_0011c3d5;
LAB_0011c59c:
    pCVar20 = (CPalThread *)local_838;
    apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
    uStack_8b8 = (ulong)auStack_858;
    apcopy[0].gp_offset = ap[0].gp_offset;
    apcopy[0].fp_offset = ap[0].fp_offset;
    uVar6 = vsnprintf((char *)pCVar20,0x400,TempSprintfStrBuffer + 0x3f8,&uStack_8b8);
    Width_00 = Prefix;
    Width = Type;
    PAL_printf_arg_remover((va_list *)auStack_858,Prefix,Type,IVar8,(INT)Prefix_00);
    if (uVar6 < 0x400) {
      lpWideCharStr = (CPalThread *)0x0;
    }
    else {
      lpWideCharStr = (CPalThread *)CorUnix::InternalMalloc((long)(int)(uVar6 + 1));
      if (lpWideCharStr == (CPalThread *)0x0) {
LAB_0011cd33:
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011cd4c;
        piVar17 = __errno_location();
        *piVar17 = 8;
        goto LAB_0011cd0c;
      }
      apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
      uStack_8b8 = (ulong)auStack_858;
      apcopy[0].gp_offset = ap[0].gp_offset;
      apcopy[0].fp_offset = ap[0].fp_offset;
      vsnprintf((char *)lpWideCharStr,(long)(int)(uVar6 + 1),TempSprintfStrBuffer + 0x3f8,
                &uStack_8b8);
      PAL_printf_arg_remover((va_list *)auStack_858,Width_00,Width,IVar8,(INT)Prefix_00);
      pCVar20 = lpWideCharStr;
    }
LAB_0011cb1d:
    uVar6 = MultiByteToWideChar(0,0,(LPCSTR)pCVar20,-1,(LPWSTR)0x0,0);
    if (uVar6 != 0) {
      pthrCurrent_00 = (CPalThread *)CorUnix::InternalMalloc((long)(int)uVar6 * 2);
      if (pthrCurrent_00 == (CPalThread *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011cd4c;
        piVar17 = __errno_location();
        *piVar17 = 8;
      }
      else {
        aparg = (__va_list_tag *)0xffffffffffffffff;
        in_R9 = (LPINT)(ulong)uVar6;
        in_R8 = pthrCurrent_00;
        MultiByteToWideChar(0,0,(LPCSTR)pCVar20,-1,(LPWSTR)pthrCurrent_00,uVar6);
        iVar10 = Internal_Convertfwrite
                           (pthrCurrent_00,(void *)(long)(int)(uVar6 - 1),(size_t)stream->bsdFilePtr
                            ,(size_t)aparg,(FILE *)in_R8,(BOOL)in_R9);
        if (iVar10 != -1) {
          if (lpWideCharStr != (CPalThread *)0x0) {
            CorUnix::InternalFree(lpWideCharStr);
          }
          goto LAB_0011cb91;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011cd4c;
        piVar17 = __errno_location();
        strerror(*piVar17);
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011cd4c;
        CorUnix::InternalFree(pthrCurrent_00);
      }
      if (lpWideCharStr != (CPalThread *)0x0) goto LAB_0011ccbc;
      goto LAB_0011cd0c;
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0011cd4c;
    if (lpWideCharStr != (CPalThread *)0x0) {
      CorUnix::InternalFree(lpWideCharStr);
    }
    iVar19 = local_878;
    bVar3 = PAL_InitializeChakraCoreCalled & 1;
joined_r0x0011cc5d:
    local_878 = iVar19;
    if (bVar3 != 0) {
LAB_0011cd0c:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return local_878;
      }
      __stack_chk_fail();
    }
  }
LAB_0011cd4c:
  abort();
}

Assistant:

int CoreVfwprintf(CPalThread *pthrCurrent, PAL_FILE *stream, const char16_t *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCWSTR Fmt = format;
    LPWSTR TempWStr = NULL;
    LPWSTR WorkingWStr = NULL;
    WCHAR TempWChar[2];
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT TempInt;
    BOOL WStrWasMalloced = FALSE;
    int mbtowcResult;
    int written=0;
    int paddingReturnValue;
    int ret;
    va_list ap;

    /* fwprintf for now in the PAL is always used on file opened
       in text mode. In those case the output should be ANSI not Unicode */
    BOOL textMode = TRUE;

    PERF_ENTRY(vfwprintf);
    ENTRY("vfwprintf (stream=%p, format=%p (%S))\n",
          stream, format, format);

    va_copy(ap, aparg);

    while (*Fmt)
    {
        if(*Fmt == '%' &&
                TRUE == Internal_ExtractFormatW(pthrCurrent, &Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (((Prefix == PFF_PREFIX_LONG || Prefix == PFF_PREFIX_LONG_W) &&
                 (Type == PFF_TYPE_STRING || Type == PFF_TYPE_WSTRING)) ||
                 (Type == PFF_TYPE_WSTRING && (Flags & PFF_ZERO) != 0))
            {
                WStrWasMalloced = FALSE;

                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (Type == PFF_TYPE_STRING || Prefix == PFF_PREFIX_LONG_W)
                {
                    TempWStr = va_arg(ap, LPWSTR);
                }
                else
                {
                    /* %lS assumes a LPSTR argument. */
                    LPSTR s = va_arg(ap, LPSTR );
                    UINT Length = 0;
                    Length = MultiByteToWideChar( CP_ACP, 0, s, -1, NULL, 0 );
                    if ( Length != 0 )
                    {
                        TempWStr =
                            (LPWSTR)InternalMalloc( (Length) * sizeof( WCHAR ) );
                        if ( TempWStr )
                        {
                            WStrWasMalloced = TRUE;
                            MultiByteToWideChar( CP_ACP, 0, s, -1,
                                                 TempWStr, Length );
                        }
                        else
                        {
                            ERROR( "InternalMalloc failed.\n" );
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            va_end(ap);
                            return -1;
                        }
                    }
                    else
                    {
                        ASSERT( "Unable to convert from multibyte "
                               " to wide char.\n" );
                        LOGEXIT("vfwprintf returns int -1\n");
                        PERF_EXIT(vfwprintf);
                        va_end(ap);
                        return -1;
                    }
                }

                INT Length = PAL_wcslen(TempWStr);
                WorkingWStr = (LPWSTR) InternalMalloc((sizeof(WCHAR) * (Length + 1)));
                if (!WorkingWStr)
                {
                    ERROR("InternalMalloc failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if (WStrWasMalloced)
                    {
                        InternalFree(TempWStr);
                    }
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *WorkingWStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length)
                {
                    if (wcsncpy_s(WorkingWStr, (Length + 1), TempWStr, Precision+1) != SAFECRT_SUCCESS)
                    {
                        ERROR("Internal_AddPaddingVfwprintf failed\n");
                        if (WStrWasMalloced)
                        {
                            InternalFree(TempWStr);
                        }
                        InternalFree(WorkingWStr);
                        LOGEXIT("wcsncpy_s failed!\n");
                        PERF_EXIT(vfwprintf);
                        va_end(ap);
                        return (-1);
                    }

                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    PAL_wcscpy(WorkingWStr, TempWStr);
                }


                /* do the padding (if needed)*/
                paddingReturnValue =
                    Internal_AddPaddingVfwprintf( pthrCurrent, stream, WorkingWStr,
                                                 Width - Length,
                                                 Flags,textMode);

                if (paddingReturnValue == -1)
                {
                    ERROR("Internal_AddPaddingVfwprintf failed\n");
                    if (WStrWasMalloced)
                    {
                        InternalFree(TempWStr);
                    }
                    InternalFree(WorkingWStr);
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return (-1);
                }
                written += paddingReturnValue;

                InternalFree(WorkingWStr);
                if (WStrWasMalloced)
                {
                    InternalFree(TempWStr);
                }
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar[0] = va_arg(ap, int);
                TempWChar[1] = 0;

               /* do the padding (if needed)*/
                paddingReturnValue =
                    Internal_AddPaddingVfwprintf(pthrCurrent, stream, TempWChar,
                                                 Width - 1,
                                                 Flags,textMode);
                if (paddingReturnValue == -1)
                {
                    ERROR("Internal_AddPaddingVfwprintf failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return(-1);
                }
                written += paddingReturnValue;
            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            else
            {
                // Types that sprintf can handle.

                /* note: I'm using the wide buffer as a (char *) buffer when I
                   pass it to sprintf().  After I get the buffer back I make a
                   backup of the chars copied and then convert them to wide
                   and place them in the buffer (BufferPtr) */

                // This argument will be limited to 1024 characters.
                // It should be enough.
                size_t TEMP_COUNT = 1024;
                char TempSprintfStrBuffer[1024];
                char *TempSprintfStrPtr = NULL;
                char *TempSprintfStr = TempSprintfStrBuffer;
                LPWSTR TempWideBuffer;

                TempInt = 0;
                // %h (short) doesn't seem to be handled properly by local sprintf,
                // so we do the truncation ourselves for some cases.
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert from pointer -> int -> short to avoid warnings.
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;
                    trunc1 = trunc2;

                    TempInt = snprintf(TempSprintfStr, TEMP_COUNT, TempBuff, trunc1);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        snprintf(TempSprintfStr, TempInt, TempBuff, trunc2);
                    }
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(TempSprintfStr, TEMP_COUNT, TempBuff, s);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        snprintf(TempSprintfStr, TempInt, TempBuff, s);
                    }
                }
                else
                {
                    va_list apcopy;

                    va_copy(apcopy, ap);
                    TempInt = vsnprintf(TempSprintfStr, TEMP_COUNT, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);

                    if (TempInt < 0 || static_cast<size_t>(TempInt) >= TEMP_COUNT)
                    {
                        if (NULL == (TempSprintfStrPtr = (char*)InternalMalloc(++TempInt)))
                        {
                            ERROR("InternalMalloc failed\n");
                            LOGEXIT("vfwprintf returns int -1\n");
                            PERF_EXIT(vfwprintf);
                            pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                            va_end(ap);
                            return -1;
                        }

                        TempSprintfStr = TempSprintfStrPtr;
                        va_copy(apcopy, ap);
                        vsnprintf(TempSprintfStr, TempInt, TempBuff, apcopy);
                        va_end(apcopy);
                        PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                    }
                }

                mbtowcResult = MultiByteToWideChar(CP_ACP, 0,
                                                   TempSprintfStr, -1,
                                                   NULL, 0);

                if (mbtowcResult == 0)
                {
                    ERROR("MultiByteToWideChar failed\n");
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    va_end(ap);
                    return -1;
                }

                TempWideBuffer = (LPWSTR) InternalMalloc(mbtowcResult*sizeof(WCHAR));
                if (!TempWideBuffer)
                {
                    ERROR("InternalMalloc failed\n");
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    va_end(ap);
                    return -1;
                }

                MultiByteToWideChar(CP_ACP, 0, TempSprintfStr, -1,
                                    TempWideBuffer, mbtowcResult);

                ret = Internal_Convertfwrite(
                                    pthrCurrent,
                                    TempWideBuffer,
                                    sizeof(char16_t),
                                    mbtowcResult-1,
                                    (FILE*)stream->bsdFilePtr,
                                    textMode);

                if (-1 == ret)
                {
                    ERROR("fwrite() failed with errno == %d (%s)\n", errno, strerror(errno));
                    LOGEXIT("vfwprintf returns int -1\n");
                    PERF_EXIT(vfwprintf);
                    InternalFree(TempWideBuffer);
                    if(TempSprintfStrPtr)
                    {
                        InternalFree(TempSprintfStrPtr);
                    }
                    va_end(ap);
                    return -1;
                }
                if(TempSprintfStrPtr)
                {
                    InternalFree(TempSprintfStrPtr);
                }
                InternalFree(TempWideBuffer);
            }
        }
        else
        {
            ret = Internal_Convertfwrite(
                                    pthrCurrent,
                                    Fmt++,
                                    sizeof(char16_t),
                                    1,
                                    (FILE*)stream->bsdFilePtr,
                                    textMode); /* copy regular chars into buffer */

            if (-1 == ret)
            {
                ERROR("fwrite() failed with errno == %d\n", errno);
                LOGEXIT("vfwprintf returns int -1\n");
                PERF_EXIT(vfwprintf);
                va_end(ap);
                return -1;
            }
            ++written;
       }
    }

    LOGEXIT("vfwprintf returns int %d\n", written);
    PERF_EXIT(vfwprintf);
    va_end(ap);
    return (written);
}